

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

NumberParsingStatus __thiscall
QTextStreamPrivate::getNumber(QTextStreamPrivate *this,qulonglong *ret)

{
  QLocale *this_00;
  Data *pDVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  NumberParsingStatus extraout_EAX;
  char32_t cVar6;
  uint uVar7;
  Category CVar8;
  int iVar9;
  qulonglong qVar10;
  ushort uVar11;
  char32_t ucs4;
  NumberParsingStatus NVar12;
  QString *pQVar13;
  qulonglong qVar14;
  QChar QVar15;
  long lVar16;
  long in_FS_OFFSET;
  long local_d0;
  NumberParsingStatus local_c0;
  QString local_a8;
  QChar local_8a;
  QString local_88;
  QChar local_6a;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  scan(this,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
  consumeLastToken(this);
  iVar9 = (this->params).integerBase;
  local_c0 = extraout_EAX;
  if (iVar9 == 0) {
    local_88.d.d._0_2_ = L'\0';
    bVar4 = getChar(this,(QChar *)&local_88);
    if (!bVar4) goto LAB_00301917;
    if (local_88.d.d._0_2_ == L'0') {
      local_50.d.d._0_2_ = L'\0';
      bVar5 = getChar(this,(QChar *)&local_50);
      if (bVar5) {
        cVar6 = QChar::toLower((uint)(ushort)local_50.d.d._0_2_);
        QVar15.ucs = (char16_t)cVar6;
        local_50.d.d._0_2_ = QVar15.ucs;
        if (QVar15.ucs == L'b') {
          iVar9 = 2;
        }
        else {
          iVar9 = 0x10;
          if ((cVar6 & 0xffffU) != 0x78) {
            ucs4 = cVar6 & 0xffff;
            if (((uint)(ucs4 + L'\xffffffd0') < 10) ||
               ((0x7f < (uint)(cVar6 & 0xffffU) &&
                (CVar8 = QChar::category(ucs4), CVar8 == Number_DecimalDigit)))) {
              uVar7 = QChar::digitValue(ucs4);
              iVar9 = 8;
              if (uVar7 < 8) goto LAB_00301948;
            }
            iVar9 = 10;
          }
        }
LAB_00301948:
        pQVar13 = this->string;
        if (pQVar13 == (QString *)0x0) {
          lVar16 = this->readBufferOffset;
          pQVar13 = &this->readBuffer;
          if (lVar16 == 0) goto LAB_003019ea;
          this->readBufferOffset = lVar16 + -1;
          pDVar1 = (this->readBuffer).d.d;
          if ((pDVar1 == (Data *)0x0) ||
             (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar13,(this->readBuffer).d.size,KeepSize);
          }
          (this->readBuffer).d.ptr[lVar16 + -1] = QVar15.ucs;
        }
        else {
          lVar16 = this->stringOffset;
          if (lVar16 == 0) {
LAB_003019ea:
            QString::insert(pQVar13,0,QVar15);
          }
          else {
            this->stringOffset = lVar16 + -1;
            pDVar1 = (pQVar13->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
            }
            (pQVar13->d).ptr[lVar16 + -1] = QVar15.ucs;
          }
        }
      }
      else {
        *ret = 0;
        iVar9 = 0;
      }
      bVar4 = false;
      local_c0 = npsOk;
      if (bVar5) {
LAB_00301a09:
        QVar15.ucs = local_88.d.d._0_2_;
        pQVar13 = this->string;
        if (pQVar13 == (QString *)0x0) {
          lVar16 = this->readBufferOffset;
          pQVar13 = &this->readBuffer;
          if (lVar16 == 0) goto LAB_00301ab0;
          this->readBufferOffset = lVar16 + -1;
          pDVar1 = (this->readBuffer).d.d;
          if ((pDVar1 == (Data *)0x0) ||
             (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar13,(this->readBuffer).d.size,KeepSize);
          }
          (this->readBuffer).d.ptr[lVar16 + -1] = QVar15.ucs;
        }
        else {
          lVar16 = this->stringOffset;
          if (lVar16 == 0) {
LAB_00301ab0:
            QString::insert(pQVar13,0,local_88.d.d._0_2_);
          }
          else {
            this->stringOffset = lVar16 + -1;
            pDVar1 = (pQVar13->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
            }
            (pQVar13->d).ptr[lVar16 + -1] = QVar15.ucs;
          }
        }
        local_c0 = npsOk;
        bVar4 = true;
      }
    }
    else {
      QLocale::negativeSign(&local_50,&this->locale);
      if (local_50.d.size == 1) {
        bVar4 = *local_50.d.ptr == local_88.d.d._0_2_;
      }
      else {
        bVar4 = false;
      }
      bVar5 = true;
      if ((!bVar4) &&
         (((QLocale::positiveSign(&local_68,&this->locale), local_68.d.size != 1 ||
           (*local_68.d.ptr != local_88.d.d._0_2_)) && (9 < (ushort)local_88.d.d._0_2_ - 0x30)))) {
        if ((ushort)local_88.d.d._0_2_ < 0x80) {
          bVar5 = false;
        }
        else {
          CVar8 = QChar::category((uint)(ushort)local_88.d.d._0_2_);
          bVar5 = CVar8 == Number_DecimalDigit;
        }
      }
      if ((!bVar4) && (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar3 = (int *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_),2,0x10);
        }
      }
      QVar15.ucs = local_88.d.d._0_2_;
      iVar9 = 10;
      if (bVar5) goto LAB_00301a09;
      pQVar13 = this->string;
      if (pQVar13 == (QString *)0x0) {
        lVar16 = this->readBufferOffset;
        pQVar13 = &this->readBuffer;
        if (lVar16 == 0) goto LAB_003023a5;
        this->readBufferOffset = lVar16 + -1;
        pDVar1 = (this->readBuffer).d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(pQVar13,(this->readBuffer).d.size,KeepSize);
        }
        (this->readBuffer).d.ptr[lVar16 + -1] = QVar15.ucs;
      }
      else {
        lVar16 = this->stringOffset;
        if (lVar16 == 0) {
LAB_003023a5:
          QString::insert(pQVar13,0,local_88.d.d._0_2_);
        }
        else {
          this->stringOffset = lVar16 + -1;
          pDVar1 = (pQVar13->d).d;
          if ((pDVar1 == (Data *)0x0) ||
             (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
          }
          (pQVar13->d).ptr[lVar16 + -1] = QVar15.ucs;
        }
      }
LAB_00301917:
      bVar4 = false;
      iVar9 = 0;
      local_c0 = npsInvalidPrefix;
    }
    NVar12 = local_c0;
    if (!bVar4) goto switchD_00301af2_caseD_1;
  }
  NVar12 = npsInvalidPrefix;
  switch(iVar9 - 2U >> 1 | (uint)((iVar9 - 2U & 1) != 0) << 0x1f) {
  case 0:
    qVar14 = 0;
    local_50.d.d._0_2_ = L'\0';
    local_88.d.d._0_2_ = L'\0';
    local_a8.d.d._0_2_ = L'\0';
    bVar5 = getChar(this,(QChar *)&local_50);
    bVar4 = false;
    NVar12 = npsInvalidPrefix;
    if ((bVar5) && (local_50.d.d._0_2_ == L'0')) {
      bVar4 = getChar(this,(QChar *)&local_88);
      if ((bVar4) &&
         (cVar6 = QChar::toLower((uint)(ushort)local_88.d.d._0_2_), (short)cVar6 == 0x62)) {
        lVar16 = 0;
        qVar14 = 0;
        do {
          bVar4 = getChar(this,(QChar *)&local_a8);
          QVar15.ucs = local_a8.d.d._0_2_;
          if (!bVar4) break;
          cVar6 = QChar::toLower((uint)(ushort)local_a8.d.d._0_2_);
          uVar11 = (ushort)cVar6 & 0xfffe;
          if (uVar11 == 0x30) {
            qVar14 = (ulong)(uint)(cVar6 & 1) + qVar14 * 2;
            lVar16 = lVar16 + 1;
          }
          else {
            pQVar13 = this->string;
            if (pQVar13 == (QString *)0x0) {
              lVar2 = this->readBufferOffset;
              pQVar13 = &this->readBuffer;
              if (lVar2 == 0) goto LAB_00301c6c;
              this->readBufferOffset = lVar2 + -1;
              pDVar1 = (this->readBuffer).d.d;
              if ((pDVar1 == (Data *)0x0) ||
                 (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
              }
              (this->readBuffer).d.ptr[lVar2 + -1] = QVar15.ucs;
            }
            else {
              lVar2 = this->stringOffset;
              if (lVar2 == 0) {
LAB_00301c6c:
                QString::insert(pQVar13,0,QVar15);
              }
              else {
                this->stringOffset = lVar2 + -1;
                pDVar1 = (pQVar13->d).d;
                if ((pDVar1 == (Data *)0x0) ||
                   (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                  QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
                }
                (pQVar13->d).ptr[lVar2 + -1] = QVar15.ucs;
              }
            }
          }
        } while (uVar11 == 0x30);
        bVar4 = lVar16 != 0;
        NVar12 = local_c0;
        if (bVar4) break;
        ungetChar(this,local_88.d.d._0_2_);
        ungetChar(this,local_50.d.d._0_2_);
        NVar12 = npsMissingDigit;
      }
      else {
LAB_003020ab:
        NVar12 = npsInvalidPrefix;
        qVar14 = 0;
      }
      bVar4 = false;
    }
    break;
  default:
    goto switchD_00301af2_caseD_1;
  case 3:
    local_50.d.d._0_2_ = L'\0';
    local_88.d.d._0_2_ = L'\0';
    bVar5 = getChar(this,(QChar *)&local_50);
    bVar4 = false;
    qVar14 = 0;
    NVar12 = npsInvalidPrefix;
    if ((bVar5) && (qVar14 = 0, local_50.d.d._0_2_ == L'0')) {
      qVar14 = 0;
      lVar16 = 0;
      do {
        bVar4 = getChar(this,(QChar *)&local_88);
        QVar15.ucs = local_88.d.d._0_2_;
        if (!bVar4) break;
        cVar6 = QChar::toLower((uint)(ushort)local_88.d.d._0_2_);
        if ((cVar6 & 0xfff8U) == 0x30) {
          qVar14 = (ulong)(uint)((cVar6 & 0x37U) - 0x30) + qVar14 * 8;
          lVar16 = lVar16 + 1;
        }
        else {
          pQVar13 = this->string;
          if (pQVar13 == (QString *)0x0) {
            lVar2 = this->readBufferOffset;
            pQVar13 = &this->readBuffer;
            if (lVar2 == 0) goto LAB_00301e94;
            this->readBufferOffset = lVar2 + -1;
            pDVar1 = (this->readBuffer).d.d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
            }
            (this->readBuffer).d.ptr[lVar2 + -1] = QVar15.ucs;
          }
          else {
            lVar2 = this->stringOffset;
            if (lVar2 == 0) {
LAB_00301e94:
              QString::insert(pQVar13,0,QVar15);
            }
            else {
              this->stringOffset = lVar2 + -1;
              pDVar1 = (pQVar13->d).d;
              if ((pDVar1 == (Data *)0x0) ||
                 (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
              }
              (pQVar13->d).ptr[lVar2 + -1] = QVar15.ucs;
            }
          }
        }
      } while ((cVar6 & 0xfff8U) == 0x30);
      bVar4 = lVar16 != 0;
      NVar12 = local_c0;
      if (lVar16 == 0) {
        ungetChar(this,local_50.d.d._0_2_);
        bVar4 = false;
        NVar12 = npsMissingDigit;
      }
    }
    break;
  case 4:
    local_6a.ucs = L'\0';
    bVar4 = getChar(this,&local_6a);
    NVar12 = npsMissingDigit;
    if (bVar4) {
      this_00 = &this->locale;
      QLocale::negativeSign(&local_50,this_00);
      bVar4 = true;
      if (local_50.d.size == 1) {
        bVar4 = *local_50.d.ptr != local_6a.ucs;
      }
      if (bVar4) {
        QLocale::positiveSign(&local_88,this_00);
        bVar5 = true;
        if (local_88.d.size == 1) {
          bVar5 = *local_88.d.ptr != local_6a.ucs;
        }
      }
      else {
        bVar5 = false;
      }
      if ((bVar4) &&
         (piVar3 = (int *)CONCAT62(local_88.d.d._2_6_,local_88.d.d._0_2_), piVar3 != (int *)0x0)) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_88.d.d._2_6_,local_88.d.d._0_2_),2,0x10);
        }
      }
      piVar3 = (int *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_),2,0x10);
        }
      }
      QVar15.ucs = local_6a.ucs;
      if (bVar5) {
        if ((9 < (ushort)local_6a.ucs - 0x30) &&
           (((ushort)local_6a.ucs < 0x80 ||
            (CVar8 = QChar::category((uint)(ushort)local_6a.ucs), CVar8 != Number_DecimalDigit)))) {
          pQVar13 = this->string;
          if (pQVar13 == (QString *)0x0) {
            lVar16 = this->readBufferOffset;
            pQVar13 = &this->readBuffer;
            if (lVar16 != 0) {
              this->readBufferOffset = lVar16 + -1;
              pDVar1 = (this->readBuffer).d.d;
              if ((pDVar1 == (Data *)0x0) ||
                 (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData(pQVar13,(this->readBuffer).d.size,KeepSize);
              }
              (this->readBuffer).d.ptr[lVar16 + -1] = QVar15.ucs;
              goto LAB_0030240f;
            }
LAB_0030245a:
            QString::insert(pQVar13,0,QVar15);
          }
          else {
            lVar16 = this->stringOffset;
            if (lVar16 == 0) goto LAB_0030245a;
            this->stringOffset = lVar16 + -1;
            pDVar1 = (pQVar13->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
            }
            (pQVar13->d).ptr[lVar16 + -1] = QVar15.ucs;
          }
          bVar4 = false;
          qVar14 = 0;
          goto LAB_00302415;
        }
        iVar9 = QChar::digitValue((uint)(ushort)QVar15.ucs);
        qVar14 = (qulonglong)iVar9;
        local_d0 = 1;
      }
      else {
        qVar14 = 0;
        local_d0 = 0;
      }
      local_8a.ucs = L'\0';
      do {
        while( true ) {
          bVar4 = getChar(this,&local_8a);
          QVar15.ucs = local_8a.ucs;
          if (!bVar4) goto LAB_00302250;
          if ((9 < (ushort)local_8a.ucs - 0x30) &&
             (((ushort)local_8a.ucs < 0x80 ||
              (CVar8 = QChar::category((uint)(ushort)local_8a.ucs), CVar8 != Number_DecimalDigit))))
          break;
          iVar9 = QChar::digitValue((uint)(ushort)QVar15.ucs);
          qVar14 = (long)iVar9 + qVar14 * 10;
          local_d0 = local_d0 + 1;
        }
        bVar4 = false;
        QLocale::QLocale((QLocale *)&local_a8,C,AnyScript,AnyCountry);
        bVar5 = QLocale::equals(this_00,(QLocale *)&local_a8);
        if (!bVar5) {
          QLocale::groupSeparator(&local_50,this_00);
          if (local_50.d.size == 1) {
            bVar4 = *local_50.d.ptr == local_8a.ucs;
          }
          else {
            bVar4 = false;
          }
        }
        if ((!bVar5) &&
           (piVar3 = (int *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_), piVar3 != (int *)0x0))
        {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT62(local_50.d.d._2_6_,local_50.d.d._0_2_),2,0x10);
          }
        }
        QLocale::~QLocale((QLocale *)&local_a8);
      } while (bVar4);
      ungetChar(this,local_8a);
LAB_00302250:
      bVar4 = local_d0 != 0;
      if (local_d0 == 0) {
        NVar12 = npsMissingDigit;
      }
      else {
        QLocale::negativeSign(&local_a8,this_00);
        if (local_a8.d.size == 1) {
          bVar5 = *local_a8.d.ptr == local_6a.ucs;
        }
        else {
          bVar5 = false;
        }
        piVar3 = (int *)CONCAT62(local_a8.d.d._2_6_,local_a8.d.d._0_2_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT62(local_a8.d.d._2_6_,local_a8.d.d._0_2_),2,0x10);
          }
        }
        qVar10 = -qVar14;
        if ((long)qVar14 < 1) {
          qVar10 = qVar14;
        }
        NVar12 = local_c0;
        if (bVar5) {
          qVar14 = qVar10;
        }
      }
    }
    else {
LAB_0030240f:
      bVar4 = false;
      qVar14 = 0;
    }
LAB_00302415:
    if (!bVar4) goto switchD_00301af2_caseD_1;
    goto LAB_0030241a;
  case 7:
    local_50.d.d._0_2_ = L'\0';
    local_88.d.d._0_2_ = L'\0';
    local_a8.d.d._0_2_ = L'\0';
    bVar5 = getChar(this,(QChar *)&local_50);
    bVar4 = false;
    qVar14 = 0;
    NVar12 = npsInvalidPrefix;
    if ((bVar5) && (local_50.d.d._0_2_ == L'0')) {
      bVar4 = getChar(this,(QChar *)&local_88);
      if ((!bVar4) ||
         (cVar6 = QChar::toLower((uint)(ushort)local_88.d.d._0_2_), (short)cVar6 != 0x78))
      goto LAB_003020ab;
      qVar14 = 0;
      lVar16 = 0;
      do {
        bVar4 = getChar(this,(QChar *)&local_a8);
        QVar15.ucs = local_a8.d.d._0_2_;
        if (!bVar4) break;
        uVar7 = (ushort)local_a8.d.d._0_2_ - 0x30;
        if (9 < uVar7) {
          if ((ushort)local_a8.d.d._0_2_ - 0x41 < 6) {
            uVar7 = (ushort)local_a8.d.d._0_2_ - 0x37;
          }
          else {
            uVar7 = (ushort)local_a8.d.d._0_2_ - 0x57;
            if (5 < (ushort)local_a8.d.d._0_2_ - 0x61) {
              uVar7 = 0xffffffff;
            }
          }
        }
        if (uVar7 == 0xffffffff) {
          pQVar13 = this->string;
          if (pQVar13 == (QString *)0x0) {
            lVar2 = this->readBufferOffset;
            if (lVar2 == 0) {
              QString::insert(&this->readBuffer,0,local_a8.d.d._0_2_);
            }
            else {
              this->readBufferOffset = lVar2 + -1;
              pDVar1 = (this->readBuffer).d.d;
              if ((pDVar1 == (Data *)0x0) ||
                 (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
              }
              (this->readBuffer).d.ptr[lVar2 + -1] = QVar15.ucs;
            }
          }
          else {
            lVar2 = this->stringOffset;
            if (lVar2 == 0) {
              QString::insert(pQVar13,0,local_a8.d.d._0_2_);
            }
            else {
              this->stringOffset = lVar2 + -1;
              pDVar1 = (pQVar13->d).d;
              if ((pDVar1 == (Data *)0x0) ||
                 (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData(pQVar13,(pQVar13->d).size,KeepSize);
              }
              (pQVar13->d).ptr[lVar2 + -1] = QVar15.ucs;
            }
          }
        }
        else {
          qVar14 = qVar14 * 0x10 + (long)(int)uVar7;
          lVar16 = lVar16 + 1;
        }
      } while (uVar7 != 0xffffffff);
      bVar4 = lVar16 != 0;
      NVar12 = npsMissingDigit;
      if (bVar4) {
        NVar12 = local_c0;
      }
    }
  }
  if (bVar4) {
LAB_0030241a:
    NVar12 = npsOk;
    if (ret != (qulonglong *)0x0) {
      *ret = qVar14;
      NVar12 = npsOk;
    }
  }
switchD_00301af2_caseD_1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return NVar12;
  }
  __stack_chk_fail();
}

Assistant:

QTextStreamPrivate::NumberParsingStatus QTextStreamPrivate::getNumber(qulonglong *ret)
{
    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    // detect integer encoding
    int base = params.integerBase;
    if (base == 0) {
        QChar ch;
        if (!getChar(&ch))
            return npsInvalidPrefix;
        if (ch == u'0') {
            QChar ch2;
            if (!getChar(&ch2)) {
                // Result is the number 0
                *ret = 0;
                return npsOk;
            }
            ch2 = ch2.toLower();

            if (ch2 == u'x') {
                base = 16;
            } else if (ch2 == u'b') {
                base = 2;
            } else if (ch2.isDigit() && ch2.digitValue() >= 0 && ch2.digitValue() <= 7) {
                base = 8;
            } else {
                base = 10;
            }
            ungetChar(ch2);
        } else if (ch == locale.negativeSign() || ch == locale.positiveSign() || ch.isDigit()) {
            base = 10;
        } else {
            ungetChar(ch);
            return npsInvalidPrefix;
        }
        ungetChar(ch);
        // State of the stream is now the same as on entry
        // (cursor is at prefix),
        // and local variable 'base' has been set appropriately.
    }

    qulonglong val=0;
    switch (base) {
    case 2: {
        QChar pf1, pf2, dig;
        // Parse prefix '0b'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'b')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (n == u'0' || n == u'1') {
                val <<= 1;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf2);
            ungetChar(pf1);
            return npsMissingDigit;
        }
        break;
    }
    case 8: {
        QChar pf, dig;
        // Parse prefix u'0'
        if (!getChar(&pf) || pf != u'0')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (isOctalDigit(n)) {
                val *= 8;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf);
            return npsMissingDigit;
        }
        break;
    }
    case 10: {
        // Parse sign (or first digit)
        QChar sign;
        qsizetype ndigits = 0;
        if (!getChar(&sign))
            return npsMissingDigit;
        if (sign != locale.negativeSign() && sign != locale.positiveSign()) {
            if (!sign.isDigit()) {
                ungetChar(sign);
                return npsMissingDigit;
            }
            val += sign.digitValue();
            ndigits++;
        }
        // Parse digits
        QChar ch;
        while (getChar(&ch)) {
            if (ch.isDigit()) {
                val *= 10;
                val += ch.digitValue();
            } else if (locale != QLocale::c() && ch == locale.groupSeparator()) {
                continue;
            } else {
                ungetChar(ch);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0)
            return npsMissingDigit;
        if (sign == locale.negativeSign()) {
            qlonglong ival = qlonglong(val);
            if (ival > 0)
                ival = -ival;
            val = qulonglong(ival);
        }
        break;
    }
    case 16: {
        QChar pf1, pf2, dig;
        // Parse prefix ' 0x'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'x')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            const int h = fromHex(dig.unicode());
            if (h != -1) {
                val <<= 4;
                val += h;
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            return npsMissingDigit;
        }
        break;
    }
    default:
        // Unsupported integerBase
        return npsInvalidPrefix;
    }

    if (ret)
        *ret = val;
    return npsOk;
}